

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O1

bool tcu::isNearestCompareResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,TexComparePrecision *prec,Vec2 *coord
               ,int coordZ,float cmpReference,float result)

{
  int c;
  bool isFixedPoint;
  bool bVar1;
  CmpResultSet CVar2;
  int iVar3;
  int i;
  int j_00;
  int j;
  int c_00;
  float fVar4;
  float fVar5;
  float fVar6;
  Vec2 vBounds;
  Vec2 uBounds;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  isFixedPoint = isFixedPointDepthTextureFormat(&level->m_format);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(level->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar4 = floorf(local_38);
  fVar5 = floorf(local_34);
  fVar6 = floorf(local_40);
  c_00 = (int)fVar6;
  fVar6 = floorf(local_3c);
  iVar3 = (int)fVar6;
  bVar1 = c_00 <= iVar3;
  if (c_00 <= iVar3) {
    c = (int)fVar4;
    do {
      for (; c <= (int)fVar5; c = c + 1) {
        i = TexVerifierUtil::wrap(sampler->wrapS,c,(level->m_size).m_data[0]);
        j_00 = TexVerifierUtil::wrap(sampler->wrapT,c_00,(level->m_size).m_data[1]);
        fVar6 = lookupDepth(level,sampler,i,j_00,coordZ);
        CVar2 = execCompare(sampler->compare,fVar6,cmpReference,prec->referenceBits,isFixedPoint);
        fVar6 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
        if (((((ushort)CVar2 & 1) != 0) && (result - fVar6 <= 1.0)) && (1.0 <= fVar6 + result)) {
          return bVar1;
        }
        if (((((ushort)CVar2 >> 8 & 1) != 0) && (result - fVar6 <= 0.0)) && (0.0 <= fVar6 + result))
        {
          return bVar1;
        }
      }
      c_00 = c_00 + 1;
      bVar1 = c_00 <= iVar3;
      c = (int)fVar4;
    } while (c_00 <= iVar3);
  }
  return bVar1;
}

Assistant:

static bool isNearestCompareResultValid (const ConstPixelBufferAccess&		level,
										 const Sampler&						sampler,
										 const TexComparePrecision&			prec,
										 const Vec2&						coord,
										 const int							coordZ,
										 const float						cmpReference,
										 const float						result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(level.getFormat());
	const Vec2	uBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x());
	const int	maxI		= deFloorFloatToInt32(uBounds.y());
	const int	minJ		= deFloorFloatToInt32(vBounds.x());
	const int	maxJ		= deFloorFloatToInt32(vBounds.y());

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			const int			x		= wrap(sampler.wrapS, i, level.getWidth());
			const int			y		= wrap(sampler.wrapT, j, level.getHeight());
			const float			depth	= lookupDepth(level, sampler, x, y, coordZ);
			const CmpResultSet	resSet	= execCompare(sampler.compare, depth, cmpReference, prec.referenceBits, isFixedPointDepth);

			if (isResultInSet(resSet, result, prec.resultBits))
				return true;
		}
	}

	return false;
}